

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
deleteNode(UA_Server *server,UA_Session *session,UA_NodeId *nodeId,UA_Boolean deleteReferences)

{
  UA_ObjectNode *node_00;
  UA_ObjectTypeNode *pUVar1;
  UA_ObjectTypeNode *typenode;
  UA_Node *node;
  UA_Boolean deleteReferences_local;
  UA_NodeId *nodeId_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  node_00 = (UA_ObjectNode *)UA_NodeStore_get(server->nodestore,nodeId);
  if (node_00 == (UA_ObjectNode *)0x0) {
    server_local._4_4_ = 0x80340000;
  }
  else {
    if (((node_00->nodeClass == UA_NODECLASS_OBJECT) &&
        (pUVar1 = getObjectNodeType(server,node_00), pUVar1 != (UA_ObjectTypeNode *)0x0)) &&
       ((pUVar1->lifecycleManagement).destructor != (_func_void_UA_NodeId_void_ptr *)0x0)) {
      (*(pUVar1->lifecycleManagement).destructor)(*nodeId,node_00->instanceHandle);
    }
    if (deleteReferences) {
      removeReferences(server,session,(UA_Node *)node_00);
    }
    server_local._4_4_ = UA_NodeStore_remove(server->nodestore,nodeId);
  }
  return server_local._4_4_;
}

Assistant:

static UA_StatusCode
deleteNode(UA_Server *server, UA_Session *session,
           const UA_NodeId *nodeId, UA_Boolean deleteReferences) {
    const UA_Node *node = UA_NodeStore_get(server->nodestore, nodeId);
    if(!node)
        return UA_STATUSCODE_BADNODEIDUNKNOWN;

    /* TODO: check if the information model consistency is violated */
    /* TODO: Check if the node is a mandatory child of an object */

    /* Destroy an object before removing it */
    if(node->nodeClass == UA_NODECLASS_OBJECT) {
        /* Call the destructor from the object type */
        const UA_ObjectTypeNode *typenode = getObjectNodeType(server, (const UA_ObjectNode*)node);
        if(typenode && typenode->lifecycleManagement.destructor)
            typenode->lifecycleManagement.destructor(*nodeId, ((const UA_ObjectNode*)node)->instanceHandle);
    }

    /* Remove references to the node (not the references in the node that will
     * be deleted anyway) */
    if(deleteReferences)
        removeReferences(server, session, node);

    return UA_NodeStore_remove(server->nodestore, nodeId);
}